

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O0

_Bool background_thread_pause_check(tsdn_t *tsdn,background_thread_info_t *info)

{
  long in_RSI;
  bool bVar1;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = *(int *)(in_RSI + 0xa8) == 2;
  if (bVar1) {
    malloc_mutex_unlock((tsdn_t *)info,
                        (malloc_mutex_t *)
                        CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    malloc_mutex_lock(tsdn,(malloc_mutex_t *)info);
    malloc_mutex_unlock((tsdn_t *)info,
                        (malloc_mutex_t *)
                        CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    malloc_mutex_lock(tsdn,(malloc_mutex_t *)info);
  }
  return bVar1;
}

Assistant:

static bool
background_thread_pause_check(tsdn_t *tsdn, background_thread_info_t *info) {
	if (unlikely(info->state == background_thread_paused)) {
		malloc_mutex_unlock(tsdn, &info->mtx);
		/* Wait on global lock to update status. */
		malloc_mutex_lock(tsdn, &background_thread_lock);
		malloc_mutex_unlock(tsdn, &background_thread_lock);
		malloc_mutex_lock(tsdn, &info->mtx);
		return true;
	}

	return false;
}